

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralSubstitutionTree.hpp
# Opt level: O0

ostream * Indexing::operator<<(ostream *out,LiteralSubstitutionTree<Indexing::LiteralClause> *self)

{
  bool bVar1;
  unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
  *puVar2;
  ostream *poVar3;
  long in_RSI;
  ostream *in_RDI;
  Symbol *f;
  unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
  *t;
  unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
  *__end0;
  unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
  *__begin0;
  Stack<std::unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>_>
  *__range2;
  int i;
  undefined4 in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  Signature *in_stack_ffffffffffffffb0;
  unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
  *local_28;
  uint local_14;
  
  local_14 = 0;
  std::operator<<(in_RDI,"{ ");
  local_28 = Lib::
             Stack<std::unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>_>
             ::begin((Stack<std::unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>_>
                      *)(in_RSI + 8));
  puVar2 = Lib::
           Stack<std::unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>_>
           ::end((Stack<std::unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>_>
                  *)(in_RSI + 8));
  for (; local_28 != puVar2; local_28 = local_28 + 1) {
    std::
    unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
    ::operator->((unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
                  *)0x341b57);
    bVar1 = SubstitutionTree<Indexing::LiteralClause>::isEmpty
                      ((SubstitutionTree<Indexing::LiteralClause> *)in_stack_ffffffffffffffb0);
    if (!bVar1) {
      LiteralSubstitutionTree<Indexing::LiteralClause>::idxToFunctor(local_14);
      Kernel::Signature::getPredicate(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
      bVar1 = LiteralSubstitutionTree<Indexing::LiteralClause>::idxIsNegative(local_14);
      if (bVar1) {
        std::operator<<(in_RDI,"~");
      }
      poVar3 = Kernel::operator<<((ostream *)in_stack_ffffffffffffffb0,
                                  (Symbol *)
                                  CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      in_stack_ffffffffffffffb0 = (Signature *)std::operator<<(poVar3,"(");
      std::
      unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
      ::operator*((unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
                   *)in_stack_ffffffffffffffb0);
      poVar3 = operator<<((ostream *)in_stack_ffffffffffffffb0,
                          (SubstitutionTree<Indexing::LiteralClause> *)
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      std::operator<<(poVar3,"), ");
    }
    local_14 = local_14 + 1;
  }
  poVar3 = std::operator<<(in_RDI,"} ");
  return poVar3;
}

Assistant:

std::ostream& operator<<(std::ostream& out, LiteralSubstitutionTree const& self)
  { 
    int i = 0;
    out << "{ ";
    for (auto& t : self._trees) {
      if (!t->isEmpty()) {
        auto f = env.signature->getPredicate(idxToFunctor(i));
        if (idxIsNegative(i)) out << "~";
        out << *f << "(" << *t << "), "; 
      }
      i++;
    }
    return out << "} ";
  }